

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

void __thiscall FfsParser::~FfsParser(FfsParser *this)

{
  NvramParser *this_00;
  MeParser *this_01;
  FitParser *this_02;
  FfsParser *this_local;
  
  this_00 = this->nvramParser;
  if (this_00 != (NvramParser *)0x0) {
    NvramParser::~NvramParser(this_00);
    operator_delete(this_00,0x28);
  }
  this_01 = this->meParser;
  if (this_01 != (MeParser *)0x0) {
    MeParser::~MeParser(this_01);
    operator_delete(this_01,0x28);
  }
  this_02 = this->fitParser;
  if (this_02 != (FitParser *)0x0) {
    FitParser::~FitParser(this_02);
    operator_delete(this_02,0xa8);
  }
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::~vector(&this->protectedRanges);
  QString::~QString(&this->securityInfo);
  QByteArray::~QByteArray(&this->openedImage);
  std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>::
  ~vector(&this->messagesVector);
  return;
}

Assistant:

FfsParser::~FfsParser() {
    delete nvramParser;
    delete meParser;
    delete fitParser;
}